

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

size_t mi_ctz(size_t x)

{
  int iVar1;
  size_t x_local;
  undefined8 local_8;
  
  if (x == 0) {
    local_8 = 0x40;
  }
  else {
    iVar1 = 0;
    for (; (x & 1) == 0; x = x >> 1 | 0x8000000000000000) {
      iVar1 = iVar1 + 1;
    }
    local_8 = (size_t)iVar1;
  }
  return local_8;
}

Assistant:

static inline size_t mi_ctz(size_t x) {
  if (x==0) return MI_SIZE_BITS;
  #if (SIZE_MAX == ULONG_MAX)
    return __builtin_ctzl(x);
  #else
    return __builtin_ctzll(x);
  #endif
}